

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<float>::DeterminantInverse
          (TPZFMatrix<float> *this,float *determinant,TPZFMatrix<float> *inverse)

{
  float *pfVar1;
  long lVar2;
  TPZFNMatrix<100,_float> copy;
  TPZFNMatrix<100,_float> TStack_248;
  
  TPZFNMatrix<100,_float>::TPZFNMatrix(&TStack_248,this);
  (*(inverse->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (inverse,(this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow);
  for (lVar2 = 0; lVar2 < (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow; lVar2 = lVar2 + 1
      ) {
    pfVar1 = operator()(inverse,lVar2,lVar2);
    *pfVar1 = 1.0;
  }
  TPZMatrix<float>::Solve_LU((TPZMatrix<float> *)&TStack_248,inverse);
  *determinant = 1.0;
  for (lVar2 = 0; lVar2 < (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow; lVar2 = lVar2 + 1
      ) {
    pfVar1 = operator()(&TStack_248.super_TPZFMatrix<float>,lVar2,lVar2);
    *determinant = *pfVar1 * *determinant;
  }
  TPZFNMatrix<100,_float>::~TPZFNMatrix(&TStack_248);
  return;
}

Assistant:

void TPZFMatrix<TVar>::DeterminantInverse(TVar &determinant, TPZFMatrix<TVar> &inverse)
{
    TPZFNMatrix<100, TVar> copy(*this);
    inverse.Redim(this->Rows(),this->Rows());
    int64_t r;
    for(r=0; r<this->Rows(); r++) inverse(r,r) = 1.;
    copy.Solve_LU(&inverse);
    determinant = 1.;
    for(r=0; r<this->Rows(); r++) determinant *= copy(r,r);
}